

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O1

string * __thiscall
Type1Input::GetGlyphCharStringName_abi_cxx11_
          (string *__return_storage_ptr__,Type1Input *this,Byte inCharStringIndex)

{
  size_type sVar1;
  pointer pcVar2;
  char *__s;
  StandardEncoding standardEncoding;
  StandardEncoding local_1a;
  allocator<char> local_19;
  
  if ((this->mEncoding).EncodingType == eType1EncodingTypeCustom) {
    sVar1 = (this->mEncoding).mCustomEncoding[inCharStringIndex]._M_string_length;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (sVar1 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,".notdef","")
      ;
    }
    else {
      pcVar2 = (this->mEncoding).mCustomEncoding[inCharStringIndex]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
    }
  }
  else {
    StandardEncoding::StandardEncoding(&local_1a);
    __s = StandardEncoding::GetEncodedGlyphName(&local_1a,inCharStringIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_19);
    StandardEncoding::~StandardEncoding(&local_1a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type1Input::GetGlyphCharStringName(Byte inCharStringIndex)
{
	if(eType1EncodingTypeCustom == mEncoding.EncodingType)
	{
		if(mEncoding.mCustomEncoding[inCharStringIndex].size() == 0)
			return ".notdef";
		else
			return mEncoding.mCustomEncoding[inCharStringIndex];
	}
	else
	{
		StandardEncoding standardEncoding;

		return standardEncoding.GetEncodedGlyphName(inCharStringIndex);
	}
}